

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ghosts.c
# Opt level: O1

logical pnga_set_update5_info(Integer g_a)

{
  long lVar1;
  int *piVar2;
  long *plVar3;
  long *plVar4;
  short sVar5;
  ushort uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  C_Integer *pCVar12;
  global_array_t *pgVar13;
  int _d;
  Integer proc;
  logical lVar14;
  double *pdVar15;
  Integer *map;
  Integer *proclist;
  size_t sVar16;
  Integer IVar17;
  logical lVar18;
  long lVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  C_Integer CVar24;
  int _ndim_8;
  long lVar25;
  long lVar26;
  long lVar27;
  Integer idx;
  int _ndim_4;
  ulong uVar28;
  long ndim;
  Integer _last;
  int *piVar29;
  int _ndim;
  int local_5b8;
  int _index [7];
  double *local_560;
  Integer _hi [7];
  Integer np;
  Integer plo_rem [7];
  char err_string [256];
  Integer width [7];
  Integer thi_rem [7];
  Integer tlo_rem [7];
  Integer ld_rem [7];
  Integer ld_loc [7];
  Integer phi_rem [7];
  Integer shi_rem [7];
  Integer slo_rem [7];
  Integer plo_loc [7];
  Integer hi_loc [7];
  Integer lo_loc [7];
  Integer increment [7];
  Integer dims [7];
  
  proc = pnga_nodeid();
  lVar14 = pnga_has_ghosts(g_a);
  lVar18 = 1;
  if (lVar14 != 0) {
    lVar14 = gai_check_ghost_distr(g_a);
    pgVar13 = GA;
    if (lVar14 == 0) {
LAB_0018ac61:
      lVar18 = 0;
    }
    else {
      lVar1 = g_a + 1000;
      sVar5 = GA[lVar1].ndim;
      ndim = (long)sVar5;
      iVar7 = GA[lVar1].p_handle;
      iVar8 = GA[lVar1].elemsize;
      pdVar15 = (double *)malloc(ndim * 0x50);
      pgVar13[lVar1].cache = pdVar15;
      local_560 = GA[lVar1].cache;
      iVar9 = GA[lVar1].corner_flag;
      pnga_distribution(g_a,proc,lo_loc,hi_loc);
      if (0 < ndim) {
        lVar19 = 0;
        do {
          increment[lVar19] = 0;
          width[lVar19] = GA[g_a + 1000].width[lVar19];
          dims[lVar19] = GA[g_a + 1000].dims[lVar19];
          if ((lo_loc[lVar19] == 0) && (hi_loc[lVar19] == -1)) {
            *local_560 = 0.0;
            goto LAB_0018ac61;
          }
          lVar19 = lVar19 + 1;
        } while (ndim != lVar19);
      }
      map = (Integer *)malloc(GAnproc * 0x70 | 8);
      if (map == (Integer *)0x0) {
        pnga_error("pnga_set_update5_info:malloc failed (_ga_map)",0);
      }
      proclist = (Integer *)malloc(GAnproc << 3);
      if (proclist == (Integer *)0x0) {
        pnga_error("pnga_set_update5_info:malloc failed (_ga_proclist)",0);
      }
      if (0 < sVar5) {
        local_5b8 = (int)proc;
        lVar19 = 1;
        if (1 < ndim + -1) {
          lVar19 = ndim + -1;
        }
        idx = 0;
        do {
          lVar11 = width[idx];
          if (lVar11 != 0) {
            get_remote_block_neg(idx,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
            lVar14 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
            if (lVar14 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar16 = strlen(err_string);
              sprintf(err_string + (int)sVar16," [%ld:%ld ",slo_rem[0],shi_rem[0]);
              sVar16 = strlen(err_string);
              iVar22 = (int)sVar16;
              IVar17 = pnga_ndim(g_a);
              if (1 < IVar17) {
                lVar25 = 1;
                do {
                  sprintf(err_string + (int)sVar16,",%ld:%ld ",slo_rem[lVar25],shi_rem[lVar25]);
                  sVar16 = strlen(err_string);
                  iVar22 = (int)sVar16;
                  lVar25 = lVar25 + 1;
                  IVar17 = pnga_ndim(g_a);
                } while (lVar25 < IVar17);
              }
              (err_string + iVar22)[0] = ']';
              (err_string + iVar22)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            piVar29 = (int *)((long)local_560 + ndim * 4 + 0x10);
            piVar2 = piVar29 + ndim;
            plVar3 = (long *)(piVar2 + ndim);
            lVar25 = *proclist;
            *plVar3 = lVar25;
            if (-1 < iVar7) {
              *plVar3 = (long)PGRP_LIST[iVar7].inv_map_proc_list[lVar25];
            }
            pnga_distribution(g_a,*plVar3,tlo_rem,thi_rem);
            pgVar13 = GA;
            lVar25 = 0;
            do {
              if (increment[lVar25] == 0) {
                if (idx == lVar25) {
                  lVar26 = width[lVar25];
                  plo_rem[lVar25] = lVar26 + (thi_rem[lVar25] - tlo_rem[lVar25]) + 1;
                  lVar20 = (thi_rem[lVar25] - tlo_rem[lVar25]) + lVar26 * 2;
                }
                else {
                  lVar26 = width[lVar25];
                  plo_rem[lVar25] = lVar26;
                  lVar20 = (thi_rem[lVar25] + lVar26) - tlo_rem[lVar25];
                }
              }
              else {
                plo_rem[lVar25] = 0;
                lVar20 = (increment[lVar25] + thi_rem[lVar25]) - tlo_rem[lVar25];
                lVar26 = 0;
              }
              phi_rem[lVar25] = lVar20;
              plo_loc[lVar25] = lVar26;
              lVar25 = lVar25 + 1;
            } while (ndim != lVar25);
            uVar6 = GA[lVar1].ndim;
            uVar28 = (ulong)(short)uVar6;
            iVar22 = GA[lVar1].distr_type;
            if (iVar22 - 1U < 3) {
              uVar23 = (long)local_5b8 % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar23;
              if (1 < (short)uVar6) {
                uVar23 = uVar23 & 0xffffffff;
                lVar25 = 0;
                IVar17 = proc;
                do {
                  IVar17 = (long)((int)IVar17 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar25];
                  uVar23 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar25 + 1];
                  _index[lVar25 + 1] = (int)uVar23;
                  lVar25 = lVar25 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar25);
              }
              if (0 < (short)uVar6) {
                lVar25 = 0;
                do {
                  iVar21 = *(int *)((long)_index + lVar25);
                  lVar20 = *(long *)((long)GA[g_a + 1000].block_dims + lVar25 * 2);
                  *(long *)(err_string + lVar25 * 2) = lVar20 * iVar21 + 1;
                  lVar20 = ((long)iVar21 + 1) * lVar20;
                  *(long *)((long)_hi + lVar25 * 2) = lVar20;
                  lVar26 = *(long *)((long)GA[g_a + 1000].dims + lVar25 * 2);
                  if (lVar26 <= lVar20) {
                    lVar20 = lVar26;
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar20;
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar22 == 4) {
              uVar23 = (long)local_5b8 % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar23;
              if (1 < (short)uVar6) {
                uVar23 = uVar23 & 0xffffffff;
                lVar25 = 0;
                IVar17 = proc;
                do {
                  IVar17 = (long)((int)IVar17 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar25];
                  uVar23 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar25 + 1];
                  _index[lVar25 + 1] = (int)uVar23;
                  lVar25 = lVar25 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar25);
              }
              if (0 < (short)uVar6) {
                pCVar12 = GA[lVar1].mapc;
                lVar25 = 0;
                iVar21 = 0;
                do {
                  iVar10 = *(int *)((long)_index + lVar25);
                  lVar20 = (long)iVar21 + (long)iVar10;
                  *(C_Integer *)(err_string + lVar25 * 2) = pCVar12[lVar20];
                  if ((long)iVar10 < *(long *)((long)GA[lVar1].num_blocks + lVar25 * 2) + -1) {
                    lVar20 = GA[lVar1].mapc[lVar20 + 1] + -1;
                  }
                  else {
                    lVar20 = *(long *)((long)GA[lVar1].dims + lVar25 * 2);
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar20;
                  iVar21 = iVar21 + *(int *)((long)GA[lVar1].num_blocks + lVar25 * 2);
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar22 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if ((short)uVar6 < 1) {
                  lVar25 = 1;
                }
                else {
                  lVar25 = 1;
                  uVar23 = 0;
                  do {
                    lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar23];
                    uVar23 = uVar23 + 1;
                  } while (uVar28 != uVar23);
                }
                if ((-1 < proc) && (proc < lVar25)) {
                  if (0 < (short)uVar6) {
                    pCVar12 = GA[lVar1].mapc;
                    uVar23 = 0;
                    lVar25 = 0;
                    IVar17 = proc;
                    do {
                      lVar26 = (long)GA[g_a + 1000].nblock[uVar23];
                      lVar20 = IVar17 % lVar26;
                      width[uVar23 - 0x20] = pCVar12[lVar20 + lVar25];
                      if (lVar20 == lVar26 + -1) {
                        CVar24 = GA[g_a + 1000].dims[uVar23];
                      }
                      else {
                        CVar24 = pCVar12[lVar20 + lVar25 + 1] + -1;
                      }
                      lVar25 = lVar25 + lVar26;
                      _hi[uVar23] = CVar24;
                      uVar23 = uVar23 + 1;
                      IVar17 = IVar17 / lVar26;
                    } while (uVar28 != uVar23);
                  }
                  goto LAB_0018991e;
                }
              }
              else if (proc < GA[lVar1].num_rstrctd) {
                if ((short)uVar6 < 1) {
                  lVar25 = 1;
                }
                else {
                  lVar25 = 1;
                  uVar23 = 0;
                  do {
                    lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar23];
                    uVar23 = uVar23 + 1;
                  } while (uVar28 != uVar23);
                }
                if ((-1 < proc) && (proc < lVar25)) {
                  if (0 < (short)uVar6) {
                    pCVar12 = GA[lVar1].mapc;
                    uVar23 = 0;
                    lVar25 = 0;
                    IVar17 = proc;
                    do {
                      lVar26 = (long)GA[g_a + 1000].nblock[uVar23];
                      lVar20 = IVar17 % lVar26;
                      width[uVar23 - 0x20] = pCVar12[lVar20 + lVar25];
                      if (lVar20 == lVar26 + -1) {
                        CVar24 = GA[g_a + 1000].dims[uVar23];
                      }
                      else {
                        CVar24 = pCVar12[lVar20 + lVar25 + 1] + -1;
                      }
                      lVar25 = lVar25 + lVar26;
                      _hi[uVar23] = CVar24;
                      uVar23 = uVar23 + 1;
                      IVar17 = IVar17 / lVar26;
                    } while (uVar28 != uVar23);
                  }
                  goto LAB_0018991e;
                }
              }
              if (0 < (short)uVar6) {
                memset(err_string,0,uVar28 * 8);
                memset(_hi,0xff,uVar28 * 8);
              }
            }
LAB_0018991e:
            if (uVar28 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar13[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar6 < 2) {
              lVar25 = 1;
              lVar20 = 0;
            }
            else {
              lVar25 = 1;
              lVar26 = 0;
              lVar20 = 0;
              do {
                lVar20 = lVar20 + plo_loc[lVar26] * lVar25;
                lVar27 = (_hi[lVar26] - width[lVar26 + -0x20]) +
                         pgVar13[g_a + 1000].width[lVar26] * 2 + 1;
                ld_loc[lVar26] = lVar27;
                lVar25 = lVar25 * lVar27;
                lVar26 = lVar26 + 1;
              } while (uVar28 - 1 != lVar26);
            }
            iVar21 = pgVar13[lVar1].elemsize;
            local_560[1] = (double)(pgVar13[lVar1].ptr[proc] +
                                   (lVar25 * plo_loc[uVar28 - 1] + lVar20) * (long)iVar21);
            if (iVar22 - 1U < 3) {
              lVar25 = *plVar3;
              uVar23 = (long)(int)lVar25 % pgVar13[lVar1].num_blocks[0];
              _index[0] = (int)uVar23;
              if (1 < (short)uVar6) {
                uVar23 = uVar23 & 0xffffffff;
                lVar20 = 0;
                do {
                  lVar25 = (long)((int)lVar25 - (int)uVar23) /
                           pgVar13[g_a + 1000].num_blocks[lVar20];
                  uVar23 = (long)(int)lVar25 % pgVar13[g_a + 1000].num_blocks[lVar20 + 1];
                  _index[lVar20 + 1] = (int)uVar23;
                  lVar20 = lVar20 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar20);
              }
              if (0 < (short)uVar6) {
                lVar25 = 0;
                do {
                  iVar22 = *(int *)((long)_index + lVar25);
                  lVar20 = *(long *)((long)pgVar13[g_a + 1000].block_dims + lVar25 * 2);
                  *(long *)(err_string + lVar25 * 2) = lVar20 * iVar22 + 1;
                  lVar20 = ((long)iVar22 + 1) * lVar20;
                  *(long *)((long)_hi + lVar25 * 2) = lVar20;
                  lVar26 = *(long *)((long)pgVar13[g_a + 1000].dims + lVar25 * 2);
                  if (lVar26 <= lVar20) {
                    lVar20 = lVar26;
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar20;
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar22 == 4) {
              lVar25 = *plVar3;
              uVar23 = (long)(int)lVar25 % pgVar13[lVar1].num_blocks[0];
              _index[0] = (int)uVar23;
              if (1 < (short)uVar6) {
                uVar23 = uVar23 & 0xffffffff;
                lVar20 = 0;
                do {
                  lVar25 = (long)((int)lVar25 - (int)uVar23) /
                           pgVar13[g_a + 1000].num_blocks[lVar20];
                  uVar23 = (long)(int)lVar25 % pgVar13[g_a + 1000].num_blocks[lVar20 + 1];
                  _index[lVar20 + 1] = (int)uVar23;
                  lVar20 = lVar20 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar20);
              }
              if (0 < (short)uVar6) {
                pCVar12 = pgVar13[lVar1].mapc;
                lVar25 = 0;
                iVar22 = 0;
                do {
                  iVar10 = *(int *)((long)_index + lVar25);
                  lVar20 = (long)iVar22 + (long)iVar10;
                  *(C_Integer *)(err_string + lVar25 * 2) = pCVar12[lVar20];
                  if ((long)iVar10 < *(long *)((long)pgVar13[lVar1].num_blocks + lVar25 * 2) + -1) {
                    lVar20 = pgVar13[lVar1].mapc[lVar20 + 1] + -1;
                  }
                  else {
                    lVar20 = *(long *)((long)pgVar13[lVar1].dims + lVar25 * 2);
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar20;
                  iVar22 = iVar22 + *(int *)((long)pgVar13[lVar1].num_blocks + lVar25 * 2);
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar22 == 0) {
              if (pgVar13[lVar1].num_rstrctd == 0) {
                if ((short)uVar6 < 1) {
                  lVar25 = 1;
                }
                else {
                  lVar25 = 1;
                  uVar23 = 0;
                  do {
                    lVar25 = lVar25 * pgVar13[g_a + 1000].nblock[uVar23];
                    uVar23 = uVar23 + 1;
                  } while (uVar28 != uVar23);
                }
                lVar20 = *plVar3;
                if (lVar20 < 0 || lVar25 <= lVar20) {
LAB_00189d80:
                  if (0 < (short)uVar6) {
                    memset(err_string,0,uVar28 << 3);
LAB_00189db3:
                    memset(_hi,0xff,uVar28 << 3);
                  }
                }
                else if (0 < (short)uVar6) {
                  pCVar12 = pgVar13[lVar1].mapc;
                  lVar25 = 0;
                  uVar23 = 0;
                  do {
                    lVar27 = (long)pgVar13[g_a + 1000].nblock[uVar23];
                    lVar26 = lVar20 % lVar27;
                    width[uVar23 - 0x20] = pCVar12[lVar26 + lVar25];
                    if (lVar26 == lVar27 + -1) {
                      CVar24 = pgVar13[g_a + 1000].dims[uVar23];
                    }
                    else {
                      CVar24 = pCVar12[lVar26 + lVar25 + 1] + -1;
                    }
                    lVar25 = lVar25 + lVar27;
                    _hi[uVar23] = CVar24;
                    uVar23 = uVar23 + 1;
                    lVar20 = lVar20 / lVar27;
                  } while (uVar28 != uVar23);
                }
              }
              else {
                lVar25 = *plVar3;
                if (lVar25 < pgVar13[lVar1].num_rstrctd) {
                  if ((short)uVar6 < 1) {
                    lVar20 = 1;
                  }
                  else {
                    lVar20 = 1;
                    uVar23 = 0;
                    do {
                      lVar20 = lVar20 * pgVar13[g_a + 1000].nblock[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar28 != uVar23);
                  }
                  if ((lVar25 < 0) || (lVar20 <= lVar25)) goto LAB_00189d80;
                  if (0 < (short)uVar6) {
                    pCVar12 = pgVar13[lVar1].mapc;
                    lVar20 = 0;
                    uVar23 = 0;
                    do {
                      lVar27 = (long)pgVar13[g_a + 1000].nblock[uVar23];
                      lVar26 = lVar25 % lVar27;
                      width[uVar23 - 0x20] = pCVar12[lVar26 + lVar20];
                      if (lVar26 == lVar27 + -1) {
                        CVar24 = pgVar13[g_a + 1000].dims[uVar23];
                      }
                      else {
                        CVar24 = pCVar12[lVar26 + lVar20 + 1] + -1;
                      }
                      lVar20 = lVar20 + lVar27;
                      _hi[uVar23] = CVar24;
                      uVar23 = uVar23 + 1;
                      lVar25 = lVar25 / lVar27;
                    } while (uVar28 != uVar23);
                  }
                }
                else if (0 < (short)uVar6) {
                  memset(err_string,0,(ulong)uVar6 << 3);
                  goto LAB_00189db3;
                }
              }
            }
            if (uVar28 == 1) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar13[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar6 < 2) {
              lVar25 = 1;
              lVar20 = 0;
            }
            else {
              lVar25 = 1;
              lVar26 = 0;
              lVar20 = 0;
              do {
                lVar20 = lVar20 + plo_rem[lVar26] * lVar25;
                lVar27 = (_hi[lVar26] - width[lVar26 + -0x20]) +
                         pgVar13[g_a + 1000].width[lVar26] * 2 + 1;
                ld_rem[lVar26] = lVar27;
                lVar25 = lVar25 * lVar27;
                lVar26 = lVar26 + 1;
              } while (uVar28 - 1 != lVar26);
            }
            *local_560 = (double)(pgVar13[lVar1].ptr[*plVar3] +
                                 (lVar25 * plo_rem[uVar28 - 1] + lVar20) * (long)iVar21);
            *(int *)(local_560 + 2) = iVar8;
            *(int *)((long)local_560 + ndim * 4 + 0x10) = iVar8;
            if (sVar5 != 1) {
              iVar22 = *piVar29;
              lVar25 = 0;
              do {
                *(int *)((long)piVar29 + lVar25) = iVar22 * *(int *)((long)ld_rem + lVar25 * 2);
                *(int *)((long)local_560 + lVar25 + 0x10) =
                     *(int *)((long)local_560 + lVar25 + 0x10) * *(int *)((long)ld_loc + lVar25 * 2)
                ;
                iVar22 = *(int *)((long)piVar29 + lVar25);
                *(int *)((long)local_560 + lVar25 + ndim * 4 + 0x14) = iVar22;
                *(undefined4 *)((long)local_560 + lVar25 + 0x14) =
                     *(undefined4 *)((long)local_560 + lVar25 + 0x10);
                lVar25 = lVar25 + 4;
              } while (lVar19 << 2 != lVar25);
            }
            lVar25 = 0;
            do {
              piVar2[lVar25] = ((int)phi_rem[lVar25] - (int)plo_rem[lVar25]) + 1;
              lVar25 = lVar25 + 1;
            } while (ndim != lVar25);
            *piVar2 = *piVar2 * iVar8;
            if (-1 < iVar7) {
              *plVar3 = (long)PGRP_LIST[iVar7].inv_map_proc_list[*plVar3];
            }
            get_remote_block_pos(idx,ndim,lo_loc,hi_loc,slo_rem,shi_rem,dims,width);
            lVar14 = pnga_locate_region(g_a,slo_rem,shi_rem,map,proclist,&np);
            if (lVar14 == 0) {
              builtin_strncpy(err_string,"cannot locate region: ",0x17);
              strcpy(err_string + 0x16,GA[lVar1].name);
              sVar16 = strlen(err_string);
              sprintf(err_string + (int)sVar16," [%ld:%ld ",slo_rem[0],shi_rem[0]);
              sVar16 = strlen(err_string);
              iVar22 = (int)sVar16;
              IVar17 = pnga_ndim(g_a);
              if (1 < IVar17) {
                lVar25 = 1;
                do {
                  sprintf(err_string + (int)sVar16,",%ld:%ld ",slo_rem[lVar25],shi_rem[lVar25]);
                  sVar16 = strlen(err_string);
                  iVar22 = (int)sVar16;
                  lVar25 = lVar25 + 1;
                  IVar17 = pnga_ndim(g_a);
                } while (lVar25 < IVar17);
              }
              (err_string + iVar22)[0] = ']';
              (err_string + iVar22)[1] = '\0';
              pnga_error(err_string,g_a);
            }
            piVar29 = (int *)((long)plVar3 + ndim * 4 + 0x18);
            piVar2 = piVar29 + ndim;
            plVar4 = (long *)(piVar2 + ndim);
            lVar25 = *proclist;
            *plVar4 = lVar25;
            if (-1 < iVar7) {
              *plVar4 = (long)PGRP_LIST[iVar7].inv_map_proc_list[lVar25];
            }
            local_560 = (double *)(plVar4 + 1);
            pnga_distribution(g_a,*plVar4,tlo_rem,thi_rem);
            pgVar13 = GA;
            lVar25 = 0;
            do {
              if (increment[lVar25] == 0) {
                if (idx == lVar25) {
                  plo_rem[lVar25] = 0;
                  phi_rem[lVar25] = width[lVar25] + -1;
                  lVar20 = (width[lVar25] + -1 + hi_loc[lVar25]) - lo_loc[lVar25];
                }
                else {
                  lVar20 = width[lVar25];
                  plo_rem[lVar25] = lVar20;
                  phi_rem[lVar25] = (thi_rem[lVar25] + lVar20) - tlo_rem[lVar25];
                }
              }
              else {
                plo_rem[lVar25] = 0;
                phi_rem[lVar25] = (increment[lVar25] + thi_rem[lVar25]) - tlo_rem[lVar25];
                lVar20 = 0;
              }
              plo_loc[lVar25] = lVar20;
              lVar25 = lVar25 + 1;
            } while (ndim != lVar25);
            uVar6 = GA[lVar1].ndim;
            uVar28 = (ulong)(short)uVar6;
            iVar22 = GA[lVar1].distr_type;
            if (iVar22 - 1U < 3) {
              uVar23 = (long)(int)GAme % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar23;
              if (1 < (short)uVar6) {
                uVar23 = uVar23 & 0xffffffff;
                lVar25 = 0;
                IVar17 = GAme;
                do {
                  IVar17 = (long)((int)IVar17 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar25];
                  uVar23 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar25 + 1];
                  _index[lVar25 + 1] = (int)uVar23;
                  lVar25 = lVar25 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar25);
              }
              if (0 < (short)uVar6) {
                lVar25 = 0;
                do {
                  iVar22 = *(int *)((long)_index + lVar25);
                  lVar20 = *(long *)((long)GA[g_a + 1000].block_dims + lVar25 * 2);
                  *(long *)(err_string + lVar25 * 2) = lVar20 * iVar22 + 1;
                  lVar20 = ((long)iVar22 + 1) * lVar20;
                  *(long *)((long)_hi + lVar25 * 2) = lVar20;
                  lVar26 = *(long *)((long)GA[g_a + 1000].dims + lVar25 * 2);
                  if (lVar26 <= lVar20) {
                    lVar20 = lVar26;
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar20;
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar22 == 4) {
              uVar23 = (long)(int)GAme % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar23;
              if (1 < (short)uVar6) {
                uVar23 = uVar23 & 0xffffffff;
                lVar25 = 0;
                IVar17 = GAme;
                do {
                  IVar17 = (long)((int)IVar17 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar25];
                  uVar23 = (long)(int)IVar17 % GA[g_a + 1000].num_blocks[lVar25 + 1];
                  _index[lVar25 + 1] = (int)uVar23;
                  lVar25 = lVar25 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar25);
              }
              if (0 < (short)uVar6) {
                pCVar12 = GA[lVar1].mapc;
                lVar25 = 0;
                iVar22 = 0;
                do {
                  iVar21 = *(int *)((long)_index + lVar25);
                  lVar20 = (long)iVar22 + (long)iVar21;
                  *(C_Integer *)(err_string + lVar25 * 2) = pCVar12[lVar20];
                  if ((long)iVar21 < *(long *)((long)GA[lVar1].num_blocks + lVar25 * 2) + -1) {
                    lVar20 = GA[lVar1].mapc[lVar20 + 1] + -1;
                  }
                  else {
                    lVar20 = *(long *)((long)GA[lVar1].dims + lVar25 * 2);
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar20;
                  iVar22 = iVar22 + *(int *)((long)GA[lVar1].num_blocks + lVar25 * 2);
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar22 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if ((short)uVar6 < 1) {
                  lVar25 = 1;
                }
                else {
                  lVar25 = 1;
                  uVar23 = 0;
                  do {
                    lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar23];
                    uVar23 = uVar23 + 1;
                  } while (uVar28 != uVar23);
                }
                if (GAme < 0 || lVar25 <= GAme) {
LAB_0018a59a:
                  if (0 < (short)uVar6) {
                    memset(err_string,0,uVar28 * 8);
LAB_0018a5cd:
                    memset(_hi,0xff,uVar28 * 8);
                  }
                }
                else if (0 < (short)uVar6) {
                  pCVar12 = GA[lVar1].mapc;
                  lVar25 = 0;
                  uVar23 = 0;
                  IVar17 = GAme;
                  do {
                    lVar26 = (long)GA[g_a + 1000].nblock[uVar23];
                    lVar20 = IVar17 % lVar26;
                    width[uVar23 - 0x20] = pCVar12[lVar20 + lVar25];
                    if (lVar20 == lVar26 + -1) {
                      CVar24 = GA[g_a + 1000].dims[uVar23];
                    }
                    else {
                      CVar24 = pCVar12[lVar20 + lVar25 + 1] + -1;
                    }
                    lVar25 = lVar25 + lVar26;
                    _hi[uVar23] = CVar24;
                    uVar23 = uVar23 + 1;
                    IVar17 = IVar17 / lVar26;
                  } while (uVar28 != uVar23);
                }
              }
              else if (GAme < GA[lVar1].num_rstrctd) {
                if ((short)uVar6 < 1) {
                  lVar25 = 1;
                }
                else {
                  lVar25 = 1;
                  uVar23 = 0;
                  do {
                    lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar23];
                    uVar23 = uVar23 + 1;
                  } while (uVar28 != uVar23);
                }
                if ((GAme < 0) || (lVar25 <= GAme)) goto LAB_0018a59a;
                if (0 < (short)uVar6) {
                  pCVar12 = GA[lVar1].mapc;
                  lVar25 = 0;
                  uVar23 = 0;
                  IVar17 = GAme;
                  do {
                    lVar26 = (long)GA[g_a + 1000].nblock[uVar23];
                    lVar20 = IVar17 % lVar26;
                    width[uVar23 - 0x20] = pCVar12[lVar20 + lVar25];
                    if (lVar20 == lVar26 + -1) {
                      CVar24 = GA[g_a + 1000].dims[uVar23];
                    }
                    else {
                      CVar24 = pCVar12[lVar20 + lVar25 + 1] + -1;
                    }
                    lVar25 = lVar25 + lVar26;
                    _hi[uVar23] = CVar24;
                    uVar23 = uVar23 + 1;
                    IVar17 = IVar17 / lVar26;
                  } while (uVar28 != uVar23);
                }
              }
              else if (0 < (short)uVar6) {
                memset(err_string,0,(ulong)uVar6 << 3);
                goto LAB_0018a5cd;
              }
            }
            if (uVar28 == 1) {
              ld_loc[0] = (_hi[0] - err_string._0_8_) + pgVar13[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar6 < 2) {
              lVar25 = 1;
              lVar20 = 0;
            }
            else {
              lVar25 = 1;
              lVar20 = 0;
              lVar26 = 0;
              do {
                lVar20 = lVar20 + plo_loc[lVar26] * lVar25;
                lVar27 = (_hi[lVar26] - width[lVar26 + -0x20]) +
                         pgVar13[g_a + 1000].width[lVar26] * 2 + 1;
                ld_loc[lVar26] = lVar27;
                lVar25 = lVar25 * lVar27;
                lVar26 = lVar26 + 1;
              } while (uVar28 - 1 != lVar26);
            }
            plVar3[2] = (long)(pgVar13[lVar1].ptr[GAme] +
                              (long)pgVar13[lVar1].elemsize *
                              (lVar25 * plo_loc[uVar28 - 1] + lVar20));
            pgVar13 = GA;
            uVar6 = GA[lVar1].ndim;
            uVar28 = (ulong)(short)uVar6;
            iVar22 = GA[lVar1].distr_type;
            if (iVar22 - 1U < 3) {
              lVar25 = *plVar4;
              uVar23 = (long)(int)lVar25 % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar23;
              if (1 < (short)uVar6) {
                uVar23 = uVar23 & 0xffffffff;
                lVar20 = 0;
                do {
                  lVar25 = (long)((int)lVar25 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar20];
                  uVar23 = (long)(int)lVar25 % GA[g_a + 1000].num_blocks[lVar20 + 1];
                  _index[lVar20 + 1] = (int)uVar23;
                  lVar20 = lVar20 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar20);
              }
              if (0 < (short)uVar6) {
                lVar25 = 0;
                do {
                  iVar22 = *(int *)((long)_index + lVar25);
                  lVar20 = *(long *)((long)GA[g_a + 1000].block_dims + lVar25 * 2);
                  *(long *)(err_string + lVar25 * 2) = lVar20 * iVar22 + 1;
                  lVar20 = ((long)iVar22 + 1) * lVar20;
                  *(long *)((long)_hi + lVar25 * 2) = lVar20;
                  lVar26 = *(long *)((long)GA[g_a + 1000].dims + lVar25 * 2);
                  if (lVar26 <= lVar20) {
                    lVar20 = lVar26;
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar20;
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar22 == 4) {
              lVar25 = *plVar4;
              uVar23 = (long)(int)lVar25 % GA[lVar1].num_blocks[0];
              _index[0] = (int)uVar23;
              if (1 < (short)uVar6) {
                uVar23 = uVar23 & 0xffffffff;
                lVar20 = 0;
                do {
                  lVar25 = (long)((int)lVar25 - (int)uVar23) / GA[g_a + 1000].num_blocks[lVar20];
                  uVar23 = (long)(int)lVar25 % GA[g_a + 1000].num_blocks[lVar20 + 1];
                  _index[lVar20 + 1] = (int)uVar23;
                  lVar20 = lVar20 + 1;
                } while ((uVar28 & 0xffffffff) - 1 != lVar20);
              }
              if (0 < (short)uVar6) {
                pCVar12 = GA[lVar1].mapc;
                lVar25 = 0;
                iVar22 = 0;
                do {
                  iVar21 = *(int *)((long)_index + lVar25);
                  lVar20 = (long)iVar22 + (long)iVar21;
                  *(C_Integer *)(err_string + lVar25 * 2) = pCVar12[lVar20];
                  if ((long)iVar21 < *(long *)((long)GA[lVar1].num_blocks + lVar25 * 2) + -1) {
                    lVar20 = GA[lVar1].mapc[lVar20 + 1] + -1;
                  }
                  else {
                    lVar20 = *(long *)((long)GA[lVar1].dims + lVar25 * 2);
                  }
                  *(long *)((long)_hi + lVar25 * 2) = lVar20;
                  iVar22 = iVar22 + *(int *)((long)GA[lVar1].num_blocks + lVar25 * 2);
                  lVar25 = lVar25 + 4;
                } while ((uVar28 & 0xffffffff) << 2 != lVar25);
              }
            }
            else if (iVar22 == 0) {
              if (GA[lVar1].num_rstrctd == 0) {
                if ((short)uVar6 < 1) {
                  lVar25 = 1;
                }
                else {
                  lVar25 = 1;
                  uVar23 = 0;
                  do {
                    lVar25 = lVar25 * GA[g_a + 1000].nblock[uVar23];
                    uVar23 = uVar23 + 1;
                  } while (uVar28 != uVar23);
                }
                lVar20 = *plVar4;
                if (lVar20 < 0 || lVar25 <= lVar20) {
LAB_0018aa45:
                  if (0 < (short)uVar6) {
                    memset(err_string,0,uVar28 * 8);
LAB_0018aa78:
                    memset(_hi,0xff,uVar28 * 8);
                  }
                }
                else if (0 < (short)uVar6) {
                  pCVar12 = GA[lVar1].mapc;
                  lVar25 = 0;
                  uVar23 = 0;
                  do {
                    lVar27 = (long)GA[g_a + 1000].nblock[uVar23];
                    lVar26 = lVar20 % lVar27;
                    width[uVar23 - 0x20] = pCVar12[lVar26 + lVar25];
                    if (lVar26 == lVar27 + -1) {
                      CVar24 = GA[g_a + 1000].dims[uVar23];
                    }
                    else {
                      CVar24 = pCVar12[lVar26 + lVar25 + 1] + -1;
                    }
                    lVar25 = lVar25 + lVar27;
                    _hi[uVar23] = CVar24;
                    uVar23 = uVar23 + 1;
                    lVar20 = lVar20 / lVar27;
                  } while (uVar28 != uVar23);
                }
              }
              else {
                lVar25 = *plVar4;
                if (lVar25 < GA[lVar1].num_rstrctd) {
                  if ((short)uVar6 < 1) {
                    lVar20 = 1;
                  }
                  else {
                    lVar20 = 1;
                    uVar23 = 0;
                    do {
                      lVar20 = lVar20 * GA[g_a + 1000].nblock[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar28 != uVar23);
                  }
                  if ((lVar25 < 0) || (lVar20 <= lVar25)) goto LAB_0018aa45;
                  if (0 < (short)uVar6) {
                    pCVar12 = GA[lVar1].mapc;
                    lVar20 = 0;
                    uVar23 = 0;
                    do {
                      lVar27 = (long)GA[g_a + 1000].nblock[uVar23];
                      lVar26 = lVar25 % lVar27;
                      width[uVar23 - 0x20] = pCVar12[lVar26 + lVar20];
                      if (lVar26 == lVar27 + -1) {
                        CVar24 = GA[g_a + 1000].dims[uVar23];
                      }
                      else {
                        CVar24 = pCVar12[lVar26 + lVar20 + 1] + -1;
                      }
                      lVar20 = lVar20 + lVar27;
                      _hi[uVar23] = CVar24;
                      uVar23 = uVar23 + 1;
                      lVar25 = lVar25 / lVar27;
                    } while (uVar28 != uVar23);
                  }
                }
                else if (0 < (short)uVar6) {
                  memset(err_string,0,(ulong)uVar6 << 3);
                  goto LAB_0018aa78;
                }
              }
            }
            if (uVar28 == 1) {
              ld_rem[0] = (_hi[0] - err_string._0_8_) + pgVar13[lVar1].width[0] * 2 + 1;
            }
            if ((short)uVar6 < 2) {
              lVar25 = 1;
              lVar20 = 0;
            }
            else {
              lVar25 = 1;
              lVar20 = 0;
              lVar26 = 0;
              do {
                lVar20 = lVar20 + plo_rem[lVar26] * lVar25;
                lVar27 = (_hi[lVar26] - width[lVar26 + -0x20]) +
                         pgVar13[g_a + 1000].width[lVar26] * 2 + 1;
                ld_rem[lVar26] = lVar27;
                lVar25 = lVar25 * lVar27;
                lVar26 = lVar26 + 1;
              } while (uVar28 - 1 != lVar26);
            }
            plVar3[1] = (long)(pgVar13[lVar1].ptr[*plVar4] +
                              (long)pgVar13[lVar1].elemsize *
                              (lVar25 * plo_rem[uVar28 - 1] + lVar20));
            *(int *)(plVar3 + 3) = iVar8;
            *piVar29 = iVar8;
            if (sVar5 != 1) {
              lVar25 = 0;
              do {
                *(int *)((long)piVar29 + lVar25) =
                     *(int *)((long)piVar29 + lVar25) * *(int *)((long)ld_rem + lVar25 * 2);
                *(int *)((long)plVar3 + lVar25 + 0x18) =
                     *(int *)((long)plVar3 + lVar25 + 0x18) * *(int *)((long)ld_loc + lVar25 * 2);
                *(undefined4 *)((long)plVar3 + lVar25 + ndim * 4 + 0x1c) =
                     *(undefined4 *)((long)piVar29 + lVar25);
                *(undefined4 *)((long)plVar3 + lVar25 + 0x1c) =
                     *(undefined4 *)((long)plVar3 + lVar25 + 0x18);
                lVar25 = lVar25 + 4;
              } while (lVar19 << 2 != lVar25);
            }
            lVar25 = 0;
            do {
              piVar2[lVar25] = ((int)phi_rem[lVar25] - (int)plo_rem[lVar25]) + 1;
              lVar25 = lVar25 + 1;
            } while (ndim != lVar25);
            *piVar2 = *piVar2 * iVar8;
            if (-1 < iVar7) {
              *plVar4 = (long)PGRP_LIST[iVar7].inv_map_proc_list[*plVar4];
            }
            if (iVar9 != 0) {
              increment[idx] = lVar11 * 2;
            }
          }
          idx = idx + 1;
        } while (idx != ndim);
      }
      free(map);
      free(proclist);
      lVar18 = 1;
    }
  }
  return lVar18;
}

Assistant:

logical pnga_set_update5_info(Integer g_a)
{
  int i;
  Integer *proc_rem;
  Integer size, ndim, nwidth, increment[MAXDIM],np;
  Integer width[MAXDIM];
  Integer dims[MAXDIM];
  Integer lo_loc[MAXDIM], hi_loc[MAXDIM];
  Integer plo_loc[MAXDIM]/*, phi_loc[MAXDIM]*/;
  Integer tlo_rem[MAXDIM], thi_rem[MAXDIM];
  Integer slo_rem[MAXDIM], shi_rem[MAXDIM];
  Integer plo_rem[MAXDIM], phi_rem[MAXDIM];
  Integer ld_loc[MAXDIM], ld_rem[MAXDIM];
  int *stride_loc, *stride_rem,*count;
  int idx, corner_flag;
  char **ptr_loc, **ptr_rem,*cache;
  Integer handle = GA_OFFSET + g_a;
  int cache_size;
#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
  int scope;
#endif
  Integer me = pnga_nodeid();
  Integer p_handle;
  Integer *_ga_map = NULL;
  Integer *_ga_proclist = NULL;

  /* This routine sets up the arrays that are used to transfer data
   * using the update5 algorithm. The arrays begining with the character
   * "p" represent relative indices marking the location of the data set
   * relative to the origin the local patch of the global array, all
   * other indices are in absolute coordinates and mark locations in the
   * total global array. The indices used by this routine are described
   * below.
   *
   *       lo_loc[], hi_loc[]: The lower and upper indices of the visible
   *       block of data held by the calling processor.
   *
   *       lo_rem[], hi_rem[]: The lower and upper indices of the block
   *       of data on a remote processor or processors that is needed to
   *       fill in the calling processors ghost cells. These indices are
   *       NOT corrected for wrap-around (periodic) boundary conditions
   *       so they can be negative or greater than the array dimension
   *       values held in dims[].
   *
   *       slo_rem[], shi_rem[]: Similar to lo_rem[] and hi_rem[], except
   *       that these indices have been corrected for wrap-around
   *       boundary conditions. 
   *
   *       thi_rem[], thi_rem[]: The lower and upper indices of the visible
   *       data on a remote processor.
   *
   *       plo_loc[], phi_loc[]: The indices of the local data patch that
   *       is going to be updated.
   *
   *       plo_rem[], phi_rem[]: The indices of the data patch on the
   *       remote processor that will be used to update the data on the
   *       calling processor. Note that the dimensions of the patches
   *       represented by plo_loc[], plo_rem[] and plo_loc[], phi_loc[]
   *       must be the same.
   */

  /* if global array has no ghost cells, just return */
  if (!pnga_has_ghosts(g_a)) return TRUE;

  /* Check to make sure that global array is well-behaved (all processors
     have data and the width of the data in each dimension is greater
     than the corresponding value in width[]. */
  if (!gai_check_ghost_distr(g_a)) return FALSE;

  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  size = GA[handle].elemsize;
  cache_size = 2*sizeof(char *)+3*sizeof(int)+sizeof(Integer);
  cache_size = 2*ndim*((cache_size/sizeof(double)) + 1);
  GA[handle].cache = (double *)malloc(sizeof(double)*cache_size);
  cache = (char *)GA[handle].cache;
  corner_flag = GA[handle].corner_flag;

  pnga_distribution(g_a,me,lo_loc,hi_loc); 
  for (idx=0; idx < ndim; idx++) {
    increment[idx] = 0;
    width[idx] = (Integer)GA[handle].width[idx];
    dims[idx] = (Integer)GA[handle].dims[idx];
    if (lo_loc[idx] == 0 && hi_loc[idx] == -1){
      *(char **)cache = NULL; 
      return FALSE;
    }
  } 

  _ga_map = malloc((GAnproc*2*MAXDIM+1)*sizeof(Integer));
  if(!_ga_map) pnga_error("pnga_set_update5_info:malloc failed (_ga_map)",0);
  _ga_proclist = malloc(GAnproc*sizeof(Integer));
  if(!_ga_proclist) pnga_error("pnga_set_update5_info:malloc failed (_ga_proclist)",0);

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
  for(scope=0;scope < 2; scope ++)
#endif
    for (idx=0; idx < ndim; idx++) {
      nwidth = width[idx];
      if (nwidth != 0) {  
      
        ptr_rem = (char **)cache;
        ptr_loc = (char **)(cache+sizeof(char *));
        stride_loc = (int *)(cache+2*sizeof(char *));
        stride_rem = (int *)(stride_loc+ndim);
        count = (int *)(stride_rem+ndim);
        proc_rem = (Integer *)(count+ndim);

        get_remote_block_neg(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                             dims, width);
        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        *proc_rem = (Integer)_ga_proclist[0];
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
        if(scope == 0 && ARMCI_Same_node(*proc_rem))
          goto do_negative;
#endif

        cache = (char *)(proc_rem+1);

        pnga_distribution(g_a, *proc_rem, tlo_rem, thi_rem);
        

        for (i = 0; i < ndim; i++) {
          if (increment[i] == 0) {
            if (i == idx) {
              plo_rem[i] = thi_rem[i] - tlo_rem[i] + width[i] + 1;
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + 2*width[i];
              plo_loc[i] = width[i];
              /*phi_loc[i] = 2*width[i] - 1;*/
            } else {
              plo_rem[i] = width[i];
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
              plo_loc[i] = width[i];
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
            }
          } else {
            plo_rem[i] = 0;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
            plo_loc[i] = 0;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
          }
        }
        gam_LocationWithGhosts(me, handle, plo_loc, ptr_loc, ld_loc);
        gam_LocationWithGhosts(*proc_rem, handle, plo_rem, ptr_rem, ld_rem);
 
        /* Evaluate strides on local and remote processors */
        gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
            stride_loc);
        gam_ComputeCount(ndim, plo_rem, phi_rem, count);
        count[0] *= size;
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
        do_negative:
#endif

       /*BJP proc_rem++; */
        ptr_rem = (char **)cache;
        ptr_loc = (char **)(cache+sizeof(char *));
        stride_loc = (int *)(cache+2*sizeof(char *));
        stride_rem = (int *)(stride_loc+ndim);
        count = (int *)(stride_rem+ndim);
        proc_rem = (Integer *)(count+ndim);

        get_remote_block_pos(idx, ndim, lo_loc, hi_loc, slo_rem, shi_rem,
                             dims, width);

        if (!pnga_locate_region(g_a, slo_rem, shi_rem, _ga_map,
            _ga_proclist, &np)) ga_RegionError(pnga_ndim(g_a),
            slo_rem, shi_rem, g_a);

        *proc_rem = (Integer)_ga_proclist[0];
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

#ifdef UPDATE_SAMENODE_GHOSTS_FIRST
        if(scope == 0 && ARMCI_Same_node(*proc_rem))
          continue;
#endif

        cache = (char *)(proc_rem+1);

        pnga_distribution(g_a, *proc_rem, tlo_rem, thi_rem);



        for (i = 0; i < ndim; i++) {
          if (increment[i] == 0) {
            if (i == idx) {
              plo_rem[i] = 0;
              phi_rem[i] = width[i] - 1;
              plo_loc[i] = hi_loc[i] - lo_loc[i] + width[i] - 1;
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + 2*width[i] - 1;*/
            } else {
              plo_rem[i] = width[i];
              phi_rem[i] = thi_rem[i] - tlo_rem[i] + width[i];
              plo_loc[i] = width[i];
              /*phi_loc[i] = hi_loc[i] - lo_loc[i] + width[i];*/
            }
          } else {
            plo_rem[i] = 0;
            phi_rem[i] = thi_rem[i] - tlo_rem[i] + increment[i];
            plo_loc[i] = 0;
            /*phi_loc[i] = hi_loc[i] - lo_loc[i] + increment[i];*/
          }
        }


        gam_LocationWithGhosts(GAme, handle, plo_loc, ptr_loc, ld_loc);
        gam_LocationWithGhosts(*proc_rem, handle, plo_rem, ptr_rem, ld_rem);

        gam_setstride(ndim, size, ld_loc, ld_rem, stride_rem,
            stride_loc);

        gam_ComputeCount(ndim, plo_rem, phi_rem, count);
        count[0] *= size;
        if (p_handle >= 0) {
          *proc_rem = PGRP_LIST[p_handle].inv_map_proc_list[*proc_rem];
        }

        if (corner_flag)
          increment[idx] = 2*nwidth;
      }
    }
    free(_ga_map);
    free(_ga_proclist);
    return TRUE;
}